

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O3

void __thiscall FSoundSequencePtrArray::~FSoundSequencePtrArray(FSoundSequencePtrArray *this)

{
  ulong uVar1;
  
  if ((this->super_TArray<FSoundSequence_*,_FSoundSequence_*>).Count != 0) {
    uVar1 = 0;
    do {
      M_Free((this->super_TArray<FSoundSequence_*,_FSoundSequence_*>).Array[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->super_TArray<FSoundSequence_*,_FSoundSequence_*>).Count);
  }
  TArray<FSoundSequence_*,_FSoundSequence_*>::~TArray
            (&this->super_TArray<FSoundSequence_*,_FSoundSequence_*>);
  return;
}

Assistant:

~FSoundSequencePtrArray()
	{
		for (unsigned int i = 0; i < Size(); ++i)
		{
			M_Free((*this)[i]);
		}
	}